

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main_p(int argc,char **argv)

{
  short sVar1;
  bool bVar2;
  __uid_t _Var3;
  __gid_t __gid;
  int iVar4;
  int *piVar5;
  ulong uVar6;
  char *__file;
  undefined8 uVar7;
  XInputSimulator *this;
  ssize_t sVar8;
  string local_f0 [5];
  bool ctrl_in_effect;
  bool altgr_in_effect;
  bool shift_in_effect;
  undefined1 local_c9;
  undefined1 local_c8 [7];
  bool capslock_in_effect;
  input_event event;
  uint prev_code;
  uint scan_code;
  int noclose;
  XInputSimulator *sim;
  allocator local_61;
  string local_60 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40 [32];
  undefined8 local_20;
  size_type i;
  char **argv_local;
  int argc_local;
  
  i = (size_type)argv;
  argv_local._4_4_ = argc;
  on_exit(exit_cleanup,(void *)0x0);
  process_command_line_arguments(argv_local._4_4_,(char **)i);
  _Var3 = geteuid();
  if (_Var3 != 0) {
    piVar5 = __errno_location();
    error(1,*piVar5,"Got r00t?");
  }
  if ((args.kill & 1U) != 0) {
    kill_existing_process();
  }
  if (((args.start & 1U) == 0) && ((args.flags & 1U) == 0)) {
    usage();
    exit(1);
  }
  if ((args.post_size == 0) &&
     ((uVar6 = std::__cxx11::string::empty(), (uVar6 & 1) == 0 ||
      (uVar6 = std::__cxx11::string::empty(), (uVar6 & 1) == 0)))) {
    args.post_size = 500000;
  }
  uVar6 = std::__cxx11::string::empty();
  if ((((uVar6 & 1) == 0) && ((args.flags & 1U) == 0)) && ((args.us_keymap & 1U) != 0)) {
    error(1,0,"Incompatible flags \'-m\' and \'-u\'. See usage.");
  }
  if ((args.post_size != 0) && (bVar2 = std::operator==(&args.logfile,"-"), bVar2)) {
    error(1,0,"Incompatible flags [--post-size | --post-http] and --output to stdout");
  }
  set_utf8_locale();
  if ((args.flags & 1U) == 0) {
    uVar6 = std::__cxx11::string::empty();
    if ((uVar6 & 1) == 0) {
      parse_input_keymap();
    }
    else {
      determine_system_keymap();
    }
  }
  else {
    if ((args.us_keymap & 1U) == 0) {
      determine_system_keymap();
    }
    export_keymap_to_file();
  }
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) == 0) {
    local_20 = std::__cxx11::string::find_last_of('\x10',0x2f);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_60,"/dev/input/",&local_61);
    std::__cxx11::string::substr((ulong)&sim,0x111d10);
    std::operator+(local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_60);
    std::__cxx11::string::operator=((string *)&args.device,(string *)local_40);
    std::__cxx11::string::~string((string *)local_40);
    std::__cxx11::string::~string((string *)&sim);
    std::__cxx11::string::~string(local_60);
    std::allocator<char>::~allocator((allocator<char> *)&local_61);
  }
  else {
    determine_input_device();
  }
  set_signal_handling();
  close(0);
  __file = (char *)std::__cxx11::string::c_str();
  input_fd = open(__file,0);
  if (input_fd == -1) {
    piVar5 = __errno_location();
    iVar4 = *piVar5;
    uVar7 = std::__cxx11::string::c_str();
    error(1,iVar4,"Error opening input event device \'%s\'",uVar7);
  }
  bVar2 = std::operator==(&args.logfile,"/var/log/logkeys.log");
  if (bVar2) {
    _Var3 = getuid();
    seteuid(_Var3);
    __gid = getgid();
    setegid(__gid);
  }
  this = XInputSimulator::getInstance();
  umask(0x7f);
  iVar4 = access("/var/run/logkeys.pid",0);
  if (iVar4 != -1) {
    piVar5 = __errno_location();
    error(1,*piVar5,"Another process already running? Quitting. (/var/run/logkeys.pid)");
  }
  if (((args.flags & 0x40U) == 0) && (iVar4 = daemon(0,1), iVar4 == -1)) {
    piVar5 = __errno_location();
    error(1,*piVar5,"Failed to become daemon");
  }
  seteuid(0);
  setegid(0);
  if ((args.flags & 0x40U) == 0) {
    create_PID_file();
  }
  event.value = 0;
  execute_abi_cxx11_((char *)local_f0);
  uVar6 = std::__cxx11::string::size();
  std::__cxx11::string::~string(local_f0);
  local_c9 = 1 < uVar6;
  while (sVar8 = read(input_fd,local_c8,0x18), sVar1 = event.time.tv_usec._2_2_, 0 < sVar8) {
    if ((short)event.time.tv_usec == 1) {
      if ((enabled & 1U) != 0) {
        if ((event.time.tv_usec._4_4_ == 2) || (event.time.tv_usec._4_4_ == 1)) {
          if ((event.time.tv_usec._2_2_ == 0x67) || (event.time.tv_usec._2_2_ == 0x48)) {
            XInputSimulator::mouseMoveRelative(this,0,-0x14);
          }
          if ((sVar1 == 0x6c) || (sVar1 == 0x50)) {
            XInputSimulator::mouseMoveRelative(this,0,0x14);
          }
          if ((sVar1 == 0x69) || (sVar1 == 0x4b)) {
            XInputSimulator::mouseMoveRelative(this,-0x14,0);
          }
          if ((sVar1 == 0x6a) || (sVar1 == 0x4d)) {
            XInputSimulator::mouseMoveRelative(this,0x14,0);
          }
        }
        if (event.time.tv_usec._4_4_ == 1) {
          if (sVar1 == 0x4c) {
            XInputSimulator::mouseClick(this,1);
          }
          if (sVar1 == 0x52) {
            XInputSimulator::mouseClick(this,3);
          }
        }
      }
      if ((event.time.tv_usec._4_4_ == 1) && (sVar1 == 0x61)) {
        enabled = (bool)((enabled ^ 0xffU) & 1);
      }
    }
  }
  exit(0);
}

Assistant:

int main_p(int argc, char **argv)
{
    on_exit(exit_cleanup, NULL);

    process_command_line_arguments(argc, argv);

    if (geteuid()) error(EXIT_FAILURE, errno, "Got r00t?");
    // kill existing logkeys process
    if (args.kill) kill_existing_process();

    // if neither start nor export, that must be an error
    if (!args.start && !(args.flags & FLAG_EXPORT_KEYMAP)) { usage(); exit(EXIT_FAILURE); }

    // if posting remote and post_size not set, set post_size to default [500K bytes]
    if (args.post_size == 0 && (!args.http_url.empty() || !args.irc_server.empty())) {
        args.post_size = 500000;
    }

    // check for incompatible flags
    if (!args.keymap.empty() && (!(args.flags & FLAG_EXPORT_KEYMAP) && args.us_keymap)) {             // exporting uses args.keymap also
        error(EXIT_FAILURE, 0, "Incompatible flags '-m' and '-u'. See usage.");
    }

    // check for incompatible flags: if posting remote and output is set to stdout
    if (args.post_size != 0 && ( args.logfile == "-" )) {
        error(EXIT_FAILURE, 0, "Incompatible flags [--post-size | --post-http] and --output to stdout");
    }

    set_utf8_locale();

    if (args.flags & FLAG_EXPORT_KEYMAP) {
        if (!args.us_keymap)
            determine_system_keymap();
        export_keymap_to_file();
        // = exit(0)
    }
    else if (!args.keymap.empty())             // custom keymap in use
        parse_input_keymap();
    else
        determine_system_keymap();

    if (args.device.empty()) {             // no device given with -d switch
        determine_input_device();
    }
    else {             // event device supplied as -d argument
        std::string::size_type i = args.device.find_last_of('/');
        args.device = (std::string(INPUT_EVENT_PATH) + args.device.substr(i == std::string::npos ? 0 : i + 1));
    }

    set_signal_handling();

    close(STDIN_FILENO);
    // leave stderr open

    // open input device for reading
    input_fd = open(args.device.c_str(), O_RDONLY);
    if (input_fd == -1) {
        error(EXIT_FAILURE, errno, "Error opening input event device '%s'", args.device.c_str());
    }

    // if log file is other than default, then better seteuid() to the getuid() in order to ensure user can't write to where she shouldn't!
    if (args.logfile == DEFAULT_LOG_FILE) {
        seteuid(getuid());
        setegid(getgid());
    }

    // mouskee
    XInputSimulator &sim = XInputSimulator::getInstance();
    // mouskee

    // open log file (if file doesn't exist, create it with safe 0600 permissions)
    umask(0177);

    if (access(PID_FILE, F_OK) != -1)             // PID file already exists
        error(EXIT_FAILURE, errno, "Another process already running? Quitting. (" PID_FILE ")");

    if (!(args.flags & FLAG_NO_DAEMON)) {
        int noclose = 1;                         // don't close streams (stderr used)
        if (daemon(0, noclose) == -1)                         // become daemon
            error(EXIT_FAILURE, errno, "Failed to become daemon");
    }

    // now we need those privileges back in order to create system-wide PID_FILE
    seteuid(0); setegid(0);
    if (!(args.flags & FLAG_NO_DAEMON)) {
        create_PID_file();
    }

    unsigned int scan_code, prev_code = 0;             // the key code of the pressed key (some codes are from "scan code set 1", some are different (see <linux/input.h>)
    struct input_event event;
    bool capslock_in_effect = execute(COMMAND_STR_CAPSLOCK_STATE).size() >= 2;
    bool shift_in_effect = false;
    bool altgr_in_effect = false;
    bool ctrl_in_effect = false;             // used for identifying Ctrl+C / Ctrl+D

    // infinite loop: exit gracefully by receiving SIGHUP, SIGINT or SIGTERM (of which handler closes input_fd)
    while (read(input_fd, &event, sizeof(struct input_event)) > 0) {

// these event.value-s aren't defined in <linux/input.h> ?
#define EV_MAKE   1  // when key pressed
#define EV_BREAK  0  // when key released
#define EV_REPEAT 2  // when key switches to repeating after short delay

        if (event.type != EV_KEY) continue;                         // keyboard events are always of type EV_KEY

        scan_code = event.code;
        // on key repeat ; must check before on key press
        // on key press
        if (enabled) {
            if (event.value == EV_REPEAT || event.value == EV_MAKE) {
                if (scan_code == KEY_UP || scan_code == KEY_KP8)
                    sim.mouseMoveRelative(0, -20);

                if (scan_code == KEY_DOWN || scan_code == KEY_KP2)
                    sim.mouseMoveRelative(0, 20);

                if (scan_code == KEY_LEFT || scan_code == KEY_KP4)
                    sim.mouseMoveRelative(-20, 0);

                if (scan_code == KEY_RIGHT || scan_code == KEY_KP6)
                    sim.mouseMoveRelative(20, 0);
            }

            if (event.value == EV_MAKE) {
                if (scan_code == KEY_KP5)
                    sim.mouseClick(XIS::LEFT_MOUSE_BUTTON);
                if (scan_code == KEY_KP0)
                    sim.mouseClick(XIS::RIGHT_MOUSE_BUTTON);
            }
            // on key release
            if (event.value == EV_BREAK) {
                if (scan_code == KEY_LEFTSHIFT || scan_code == KEY_RIGHTSHIFT)
                    shift_in_effect = false;
                if (scan_code == KEY_RIGHTALT)
                    altgr_in_effect = false;
                if (scan_code == KEY_LEFTCTRL || scan_code == KEY_RIGHTCTRL) {
                    ctrl_in_effect = false;
                }
            }
        }

        if (event.value == EV_MAKE) {
            if (scan_code == KEY_RIGHTCTRL)
                enabled = !enabled;
        }
    }
    exit(EXIT_SUCCESS);
}